

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_Pointee_Test::Body(iu_Matcher_x_iutest_x_Pointee_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  int ***v;
  AssertionResult *in_R8;
  GeMatcher<int> GVar3;
  string local_6e0;
  string local_6c0;
  AssertionHelper local_6a0;
  Fixed local_670;
  IsNullMatcher local_4e8;
  PointeeMatcher<iutest::detail::IsNullMatcher> local_4e0;
  undefined1 local_4d0 [8];
  AssertionResult iutest_ar_2;
  string local_488;
  AssertionHelper local_468;
  Fixed local_438;
  int local_2ac;
  GeMatcher<int> local_2a8;
  PointeeMatcher<iutest::detail::GeMatcher<int>_> local_298;
  undefined1 local_280 [8];
  AssertionResult iutest_ar_1;
  string local_238;
  AssertionHelper local_218;
  Fixed local_1e8;
  int local_4c;
  PointeeMatcher<int> local_48;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_Pointee_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_4c = 0;
  iutest::matchers::Pointee<int>((matchers *)&local_48,&local_4c);
  iutest::detail::PointeeMatcher<int>::operator()
            ((AssertionResult *)local_38,&local_48,(int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::PointeeMatcher<int>::~PointeeMatcher(&local_48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e8);
    iutest::PrintToString<int[10]>
              ((string *)&iutest_ar_1.m_result,(int (*) [10])(anonymous_namespace)::ga);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_238,pdVar2,"Pointee(0)",local_38,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x180,&local_238,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_218,&local_1e8);
    iutest::AssertionHelper::~AssertionHelper(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_2ac = 0;
  GVar3 = iutest::matchers::Ge<int>((matchers *)&local_2a8,&local_2ac);
  iutest::matchers::Pointee<iutest::detail::GeMatcher<int>>
            (&local_298,(matchers *)&local_2a8,(GeMatcher<int> *)GVar3.m_expected);
  iutest::detail::PointeeMatcher<iutest::detail::GeMatcher<int>>::operator()
            ((AssertionResult *)local_280,
             (PointeeMatcher<iutest::detail::GeMatcher<int>> *)&local_298,
             (int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::PointeeMatcher<iutest::detail::GeMatcher<int>_>::~PointeeMatcher(&local_298);
  iutest::detail::GeMatcher<int>::~GeMatcher(&local_2a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    memset(&local_438,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_438);
    iutest::PrintToString<int[10]>
              ((string *)&iutest_ar_2.m_result,(int (*) [10])(anonymous_namespace)::ga);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_488,pdVar2,"Pointee(Ge(0))",local_280,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_468,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x181,&local_488,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_468,&local_438);
    iutest::AssertionHelper::~AssertionHelper(&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_438);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  iutest::detail::AlwaysZero();
  iutest::matchers::IsNull();
  iutest::matchers::Pointee<iutest::detail::IsNullMatcher>((matchers *)&local_4e0,&local_4e8);
  iutest::detail::PointeeMatcher<iutest::detail::IsNullMatcher>::operator()
            ((AssertionResult *)local_4d0,&local_4e0,(int ***)&(anonymous_namespace)::p2);
  iutest::detail::PointeeMatcher<iutest::detail::IsNullMatcher>::~PointeeMatcher(&local_4e0);
  iutest::detail::IsNullMatcher::~IsNullMatcher(&local_4e8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    memset(&local_670,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_670);
    iutest::PrintToString<int**>(&local_6e0,(iutest *)&(anonymous_namespace)::p2,v);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_6c0,pdVar2,"Pointee(IsNull())",local_4d0,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_6a0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x183,&local_6c0,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_6a0,&local_670);
    iutest::AssertionHelper::~AssertionHelper(&local_6a0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6e0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_670);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  return;
}

Assistant:

IUTEST(Matcher, Pointee)
{
#if !defined(IUTEST_USE_GMOCK)
    IUTEST_EXPECT_THAT(ga, Pointee(0));
    IUTEST_EXPECT_THAT(ga, Pointee(Ge(0)));
#endif
    IUTEST_EXPECT_THAT(p2, Pointee(IsNull()));
}